

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O2

void __thiscall
copy_on_write<IntermediateBaseB>::copy_on_write<MultiplyDerived,void>
          (copy_on_write<IntermediateBaseB> *this,copy_on_write<MultiplyDerived> *p)

{
  IntermediateBaseB *pIVar1;
  __shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [8];
  copy_on_write<MultiplyDerived> tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->ptr_ = (IntermediateBaseB *)0x0;
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->cb_).
  super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  copy_on_write<MultiplyDerived>::copy_on_write((copy_on_write<MultiplyDerived> *)local_40,p);
  pIVar1 = (IntermediateBaseB *)&((IntermediateBaseA *)local_40)->field_0x10;
  if (local_40 == (undefined1  [8])0x0) {
    pIVar1 = (IntermediateBaseB *)0x0;
  }
  this->ptr_ = pIVar1;
  std::
  make_shared<delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>,std::shared_ptr<shared_control_block<MultiplyDerived>>>
            ((shared_ptr<shared_control_block<MultiplyDerived>_> *)
             &tmp.cb_.
              super___shared_ptr<shared_control_block<MultiplyDerived>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  static_pointer_cast<shared_control_block<IntermediateBaseB>,delegating_shared_control_block<IntermediateBaseB,MultiplyDerived>>
            ((shared_ptr<delegating_shared_control_block<IntermediateBaseB,_MultiplyDerived>_> *)
             &local_50);
  std::__shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->cb_).
              super___shared_ptr<shared_control_block<IntermediateBaseB>,_(__gnu_cxx::_Lock_policy)2>
             ,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp.cb_);
  return;
}

Assistant:

copy_on_write(const copy_on_write<U>& p)
  {
    copy_on_write<U> tmp(p);
    ptr_ = tmp.ptr_;
    cb_ = std::static_pointer_cast<shared_control_block<T>>(
        std::make_shared<delegating_shared_control_block<T, U>>(
            std::move(tmp.cb_)));
  }